

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterBufferIndexVerifier::validateSingleVariable
          (AtomicCounterBufferIndexVerifier *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  ostringstream *poVar1;
  TestContext *pTVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  GLint numActiveResources;
  int local_1a4;
  undefined1 local_1a0 [16];
  TestLog local_190 [13];
  ios_base local_128 [264];
  
  if ((((path->
        super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
        )._M_impl.super__Vector_impl_data._M_finish[-1].m_data.block)->layout).offset == 0x54) {
    local_1a0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying atomic counter buffer index, expecting a valid index",
               0x3e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_128);
    if (propValue == -1) {
      local_1a0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tError, got ",0xc);
      std::ostream::operator<<(poVar1,-1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_128);
      local_1a0._0_8_ = local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"resource atomic counter buffer index invalid","");
      pTVar2 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
      if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,(char *)local_1a0._0_8_);
      }
    }
    else {
      iVar3 = (*((this->super_SingleVariableValidator).super_PropValidator.m_renderContext)->
                _vptr_RenderContext[3])();
      local_1a4 = 0;
      (**(code **)(CONCAT44(extraout_var,iVar3) + 0x990))
                ((this->super_SingleVariableValidator).m_programID,0x92c0,0x92f5,&local_1a4);
      err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
      glu::checkError(err,
                      "getProgramInterfaceiv(..., GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, ...)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTestCase.cpp"
                      ,0x302);
      if (propValue < local_1a4) {
        return;
      }
      local_1a0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log
      ;
      poVar1 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tError, got ",0xc);
      std::ostream::operator<<(poVar1,propValue);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,", GL_ACTIVE_RESOURCES = ",0x18);
      std::ostream::operator<<(poVar1,local_1a4);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_128);
      local_1a0._0_8_ = local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"resource atomic counter buffer index invalid","");
      pTVar2 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
      if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,(char *)local_1a0._0_8_);
      }
    }
  }
  else {
    local_1a0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying atomic counter buffer index, expecting -1",0x33);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_128);
    if (propValue == -1) {
      return;
    }
    local_1a0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tError, got ",0xc);
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_128);
    local_1a0._0_8_ = local_190;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"resource atomic counter buffer index invalid","");
    pTVar2 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,(char *)local_1a0._0_8_);
    }
  }
  if ((TestLog *)local_1a0._0_8_ != local_190) {
    operator_delete((void *)local_1a0._0_8_,(ulong)((long)&(local_190[0].m_log)->flags + 1));
  }
  return;
}

Assistant:

void AtomicCounterBufferIndexVerifier::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(resource);
	DE_UNREF(implementationName);

	if (!glu::isDataTypeAtomicCounter(path.back().getVariableType()->getBasicType()))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying atomic counter buffer index, expecting -1" << tcu::TestLog::EndMessage;

		if (propValue != -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource atomic counter buffer index invalid");
		}
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying atomic counter buffer index, expecting a valid index" << tcu::TestLog::EndMessage;

		if (propValue == -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource atomic counter buffer index invalid");
		}
		else
		{
			const glw::Functions&	gl					= m_renderContext.getFunctions();
			glw::GLint				numActiveResources	= 0;

			gl.getProgramInterfaceiv(m_programID, GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, &numActiveResources);
			GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramInterfaceiv(..., GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, ...)");

			if (propValue >= numActiveResources)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << ", GL_ACTIVE_RESOURCES = " << numActiveResources << tcu::TestLog::EndMessage;
				setError("resource atomic counter buffer index invalid");
			}
		}
	}
}